

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void COVER_tryParameters(void *opaque)

{
  COVER_ctx_t *ctx;
  size_t __size;
  uint uVar1;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t params;
  COVER_dictSelection_t selection;
  void *__ptr;
  U32 *freqs;
  COVER_map_pair_t *__s;
  size_t sVar2;
  uint uVar3;
  COVER_map_t activeDmers;
  COVER_dictSelection_t ds;
  ZDICT_cover_params_t parameters;
  size_t in_stack_ffffffffffffff48;
  COVER_map_t local_a0;
  COVER_dictSelection_t local_88;
  void *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ctx = *opaque;
  local_68 = *(undefined8 *)((long)opaque + 0x18);
  uStack_60 = *(undefined8 *)((long)opaque + 0x20);
  local_58 = *(undefined8 *)((long)opaque + 0x28);
  uStack_50 = *(undefined8 *)((long)opaque + 0x30);
  local_48 = *(undefined8 *)((long)opaque + 0x38);
  uStack_40 = *(undefined8 *)((long)opaque + 0x40);
  __size = *(size_t *)((long)opaque + 0x10);
  __ptr = malloc(__size);
  local_88.dictContent = (BYTE *)0x0;
  local_88.dictSize = 0;
  local_88.totalCompressedSize = 0xffffffffffffffff;
  freqs = (U32 *)malloc(ctx->suffixSize << 2);
  uVar3 = ((int)local_68 - local_68._4_4_) + 1;
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar3 = 4 << ((byte)uVar1 & 0x1f);
  local_a0.size = uVar3;
  local_a0.sizeLog = (uVar1 ^ 0xffffffe0) + 0x22;
  local_a0.sizeMask = uVar3 - 1;
  __s = (COVER_map_pair_t *)malloc((ulong)uVar3 << 3);
  local_a0.data = __s;
  if (__s == (COVER_map_pair_t *)0x0) {
    local_a0.sizeLog = 0;
    local_a0.size = 0;
    if (g_displayLevel < 1) goto LAB_001a2522;
    COVER_tryParameters_cold_3();
  }
  else {
    memset(__s,0xff,(ulong)uVar3 << 3);
    if ((__ptr == (void *)0x0) || (freqs == (U32 *)0x0)) {
      if (g_displayLevel < 1) goto LAB_001a2522;
      COVER_tryParameters_cold_1();
    }
    else {
      local_70 = __ptr;
      memcpy(freqs,ctx->freqs,ctx->suffixSize << 2);
      __ptr = local_70;
      sVar2 = COVER_buildDictionary
                        (ctx,freqs,&local_a0,local_70,__size,
                         *(ZDICT_cover_params_t *)((long)opaque + 0x18));
      params.steps = (undefined4)uStack_60;
      params.nbThreads = uStack_60._4_4_;
      params.k = (int)local_68;
      params.d = local_68._4_4_;
      params.splitPoint = (double)local_58;
      params.shrinkDict = (undefined4)uStack_50;
      params.shrinkDictMaxRegression = uStack_50._4_4_;
      params.zParams.compressionLevel = (undefined4)local_48;
      params.zParams.notificationLevel = local_48._4_4_;
      params._40_8_ = uStack_40;
      COVER_selectDict(&local_88,(BYTE *)((long)__ptr + sVar2),__size,__size - sVar2,ctx->samples,
                       ctx->samplesSizes,(uint)ctx->nbTrainSamples,ctx->nbTrainSamples,
                       ctx->nbSamples,params,ctx->offsets,in_stack_ffffffffffffff48);
      if ((local_88.dictContent != (BYTE *)0x0 && local_88.totalCompressedSize < 0xffffffffffffff89)
         || (g_displayLevel < 1)) goto LAB_001a2522;
      COVER_tryParameters_cold_2();
    }
  }
  fflush(_stderr);
LAB_001a2522:
  free(__ptr);
  parameters_00.steps = (undefined4)uStack_60;
  parameters_00.nbThreads = uStack_60._4_4_;
  parameters_00.k = (int)local_68;
  parameters_00.d = local_68._4_4_;
  parameters_00.splitPoint = (double)local_58;
  parameters_00.shrinkDict = (undefined4)uStack_50;
  parameters_00.shrinkDictMaxRegression = uStack_50._4_4_;
  parameters_00.zParams.compressionLevel = (undefined4)local_48;
  parameters_00.zParams.notificationLevel = local_48._4_4_;
  parameters_00._40_8_ = uStack_40;
  selection.dictSize = local_88.dictSize;
  selection.dictContent = local_88.dictContent;
  selection.totalCompressedSize = local_88.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_00,selection);
  free(opaque);
  if (__s != (COVER_map_pair_t *)0x0) {
    free(__s);
  }
  local_a0.data = (COVER_map_pair_t *)0x0;
  local_a0._8_8_ = local_a0._8_8_ & 0xffffffff;
  free(local_88.dictContent);
  free(freqs);
  return;
}

Assistant:

static void COVER_tryParameters(void *opaque)
{
  /* Save parameters as local variables */
  COVER_tryParameters_data_t *const data = (COVER_tryParameters_data_t*)opaque;
  const COVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Allocate space for hash table, dict, and freqs */
  COVER_map_t activeDmers;
  BYTE* const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* const freqs = (U32*)malloc(ctx->suffixSize * sizeof(U32));
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    goto _cleanup;
  }
  if (!dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ctx->suffixSize * sizeof(U32));
  /* Build the dictionary */
  {
    const size_t tail = COVER_buildDictionary(ctx, freqs, &activeDmers, dict,
                                              dictBufferCapacity, parameters);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
        ctx->samples, ctx->samplesSizes, (unsigned)ctx->nbTrainSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
        totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  COVER_map_destroy(&activeDmers);
  COVER_dictSelectionFree(selection);
  free(freqs);
}